

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

int Mvc_CoverCheckSuppContainment(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  Mvc_Cube_t *pMVar1;
  uint uVar2;
  int _i_;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcUtils.c"
                  ,0xfa,"int Mvc_CoverCheckSuppContainment(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  Mvc_CoverAllocateMask(pCover1);
  Mvc_CoverSupport(pCover1,pCover1->pMask);
  Mvc_CoverAllocateMask(pCover2);
  Mvc_CoverSupport(pCover2,pCover2->pMask);
  pMVar1 = pCover2->pMask;
  uVar3 = *(uint *)&pMVar1->field_0x8 & 0xffffff;
  if (uVar3 == 0) {
    uVar2 = ~pCover1->pMask->pData[0] & pMVar1->pData[0];
  }
  else if (uVar3 == 1) {
    if ((pMVar1->pData[0] & ~pCover1->pMask->pData[0]) == 0) {
      uVar2 = (uint)((*(uint *)&pMVar1->field_0x14 & ~*(uint *)&pCover1->pMask->field_0x14) != 0);
    }
    else {
      uVar2 = 1;
    }
  }
  else {
    uVar2 = 1;
    do {
      if ((int)uVar3 < 0) {
        uVar2 = 0;
        break;
      }
      uVar4 = (ulong)uVar3;
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 - 1;
    } while ((pMVar1->pData[uVar5] & ~pCover1->pMask->pData[uVar4]) == 0);
  }
  return (int)(uVar2 == 0);
}

Assistant:

int Mvc_CoverCheckSuppContainment( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    int Result;
    assert( pCover1->nBits == pCover2->nBits );
    // set the supports
    Mvc_CoverAllocateMask( pCover1 );
    Mvc_CoverSupport( pCover1, pCover1->pMask );
    Mvc_CoverAllocateMask( pCover2 );
    Mvc_CoverSupport( pCover2, pCover2->pMask );
    // check the containment
    Mvc_CubeBitNotImpl( Result, pCover2->pMask, pCover1->pMask );
    return !Result;
}